

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceNormal(uint32 *wp,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  undefined1 *puVar3;
  uint local_48;
  uint local_44;
  uint32 i_1;
  uint32 i;
  uint8 *p;
  V3d *d;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *wp_local;
  
  pVVar2 = g->morphTargets->normals;
  local_48 = idx;
  local_44 = idx;
  _i_1 = wp;
  if ((g->flags & 0x10) == 0) {
    for (; local_48 < idx + n; local_48 = local_48 + 1) {
      *(undefined1 *)_i_1 = 0;
      puVar3 = (undefined1 *)((long)_i_1 + 2);
      *(undefined1 *)((long)_i_1 + 1) = 0;
      _i_1 = (uint32 *)((long)_i_1 + 3);
      *puVar3 = 0;
    }
  }
  else {
    for (; local_44 < idx + n; local_44 = local_44 + 1) {
      uVar1 = m->indices[local_44];
      *(char *)_i_1 = (char)(int)((float)pVVar2[uVar1].x * 127.0);
      puVar3 = (undefined1 *)((long)_i_1 + 2);
      *(char *)((long)_i_1 + 1) = (char)(int)((float)pVVar2[uVar1].y * 127.0);
      _i_1 = (uint32 *)((long)_i_1 + 3);
      *puVar3 = (char)(int)((float)pVVar2[uVar1].z * 127.0);
    }
  }
  while (((ulong)_i_1 & 0xf) != 0) {
    *(undefined1 *)_i_1 = 0;
    _i_1 = (uint32 *)((long)_i_1 + 1);
  }
  return _i_1;
}

Assistant:

uint32*
instanceNormal(uint32 *wp, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	V3d *d = g->morphTargets[0].normals;
	uint8 *p = (uint8*)wp;
	if((g->flags & Geometry::NORMALS))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j].x*127.0f;
			*p++ = d[j].y*127.0f;
			*p++ = d[j].z*127.0f;
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return (uint32*)p;
}